

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
dynet::PickElement::forward_dev_impl<dynet::Device_CPU>
          (PickElement *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  uint uVar1;
  Tensor *pTVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  pointer puVar4;
  uint uVar5;
  ostream *poVar6;
  uint rindex;
  ulong uVar7;
  int iVar8;
  
  if (this->pval == (uint *)0x0) {
    pvVar3 = this->pvals;
    if (pvVar3 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                    ,0x546,
                    "void dynet::PickElement::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                   );
    }
    if ((long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2 != (ulong)(fx->d).bd) {
      __assert_fail("pvals->size() == fx.d.batch_elems()",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                    ,0x547,
                    "void dynet::PickElement::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                   );
    }
    uVar5 = Dim::batch_size(&(*(xs->
                               super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                               )._M_impl.super__Vector_impl_data._M_start)->d);
    iVar8 = 0;
    rindex = 0;
    while( true ) {
      uVar7 = (ulong)rindex;
      puVar4 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->pvals->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar4 >> 2) <= uVar7) {
        return;
      }
      uVar1 = puVar4[uVar7];
      pTVar2 = *(xs->
                super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar2->d).d[0] <= uVar1) break;
      TensorTools::CopyElement(pTVar2,uVar1 + iVar8,fx,rindex);
      rindex = rindex + 1;
      iVar8 = iVar8 + uVar5;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"PickElement::forward_impl requested element ");
    uVar5 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar7];
  }
  else {
    uVar5 = *this->pval;
    pTVar2 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 < (pTVar2->d).d[0]) {
      TensorTools::CopyElement(pTVar2,uVar5,fx,0);
      return;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"PickElement::forward_impl requested element ");
    uVar5 = *this->pval;
  }
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar5);
  poVar6 = std::operator<<(poVar6," from a vector of length ");
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,((*(xs->
                                super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                                )._M_impl.super__Vector_impl_data._M_start)->d).d[0]);
  std::endl<char,std::char_traits<char>>(poVar6);
  abort();
}

Assistant:

void PickElement::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if(pval) {
    if (*pval >= xs[0]->d.rows()) {
      cerr << "PickElement::forward_impl requested element " << *pval
           << " from a vector of length " << xs[0]->d.rows() << endl;
      abort();
    }
    TensorTools::CopyElement(*xs[0], *pval, fx, 0);
  } else {
    assert(pvals);
    assert(pvals->size() == fx.d.batch_elems());
    int batch_size = xs[0]->d.batch_size();
    for(unsigned b = 0; b < pvals->size(); ++b) {
      if ((*pvals)[b] >= xs[0]->d.rows()) {
        cerr << "PickElement::forward_impl requested element " << (*pvals)[b]
             << " from a vector of length " << xs[0]->d.rows() << endl;
        abort();
      }
      TensorTools::CopyElement(*xs[0], b*batch_size + (*pvals)[b], fx, b);
    }
  }
}